

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

bool Fossilize::json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               (VkRenderPassCreateInfo2 *pass,MemoryPoolAllocator<rapidjson::CrtAllocator> *alloc,
               Value *out_value)

{
  uint uVar1;
  VkSubpassDependency2 *pVVar2;
  void *pvVar3;
  VkAttachmentDescription2 *pVVar4;
  VkSubpassDescription2 *pVVar5;
  bool bVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  Value input;
  Value view_masks;
  Value dep;
  Data local_118;
  Value attachments;
  Value subpasses;
  Value deps;
  StringRefType local_d0;
  StringRefType local_c0;
  StringRefType local_b0;
  StringRefType local_a0;
  StringRefType local_90;
  StringRefType local_80;
  StringRefType local_70;
  StringRefType local_60;
  StringRefType local_50;
  StringRefType local_40;
  
  local_118.n.i64 = (Number)0x0;
  local_118.s.str = (Ch *)0x3000000000000;
  input.data_._4_1_ = '\0';
  input.data_._5_1_ = '\0';
  input.data_._6_1_ = '\0';
  input.data_._7_1_ = '\0';
  input.data_._0_4_ = pass->flags;
  view_masks.data_.s.str = (Ch *)0x405000000150d6f;
  view_masks.data_.n = (Number)0x5;
  input.data_.s.str = (Ch *)((ulong)(-1 < (int)pass->flags) << 0x35 | 0x1d6000000000000);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_118.s,&view_masks,&input,alloc);
  deps.data_.n = (Number)0x0;
  deps.data_.s.str = (Ch *)0x4000000000000;
  subpasses.data_.n = (Number)0x0;
  subpasses.data_.s.str = (Ch *)0x4000000000000;
  attachments.data_.n = (Number)0x0;
  attachments.data_.s.str = (Ch *)0x4000000000000;
  if (pass->pCorrelatedViewMasks != (uint32_t *)0x0) {
    view_masks.data_.n = (Number)0x0;
    view_masks.data_.s.str = (Ch *)0x4000000000000;
    if (pass->correlatedViewMaskCount != 0) {
      uVar9 = 0;
      do {
        input.data_._4_1_ = '\0';
        input.data_._5_1_ = '\0';
        input.data_._6_1_ = '\0';
        input.data_._7_1_ = '\0';
        input.data_._0_4_ = pass->pCorrelatedViewMasks[uVar9];
        input.data_.s.str =
             (Ch *)((ulong)(-1 < (int)pass->pCorrelatedViewMasks[uVar9]) << 0x35 | 0x1d6000000000000
                   );
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::PushBack(&view_masks,&input,alloc);
        uVar9 = uVar9 + 1;
      } while (uVar9 < pass->correlatedViewMaskCount);
    }
    input.data_.s.str = (Ch *)0x405000000150fe1;
    input.data_.n = (Number)0x13;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_118.s,&input,&view_masks,alloc);
  }
  if (pass->pDependencies != (VkSubpassDependency2 *)0x0) {
    if (pass->dependencyCount != 0) {
      lVar8 = 0x2c;
      uVar9 = 0;
      do {
        pVVar2 = pass->pDependencies;
        dep.data_.n = (Number)0x0;
        dep.data_.s.str = (Ch *)0x3000000000000;
        uVar1 = *(uint *)((long)pVVar2 + lVar8 + -4);
        input.data_._4_1_ = '\0';
        input.data_._5_1_ = '\0';
        input.data_._6_1_ = '\0';
        input.data_._7_1_ = '\0';
        input.data_._0_4_ = uVar1;
        view_masks.data_.s.str = (Ch *)0x40500000015321c;
        view_masks.data_.n = (Number)0xf;
        input.data_.s.str = (Ch *)((ulong)(-1 < (int)uVar1) << 0x35 | 0x1d6000000000000);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember(&dep,&view_masks,&input,alloc);
        uVar1 = *(uint *)((long)pVVar2 + lVar8 + -8);
        input.data_._4_1_ = '\0';
        input.data_._5_1_ = '\0';
        input.data_._6_1_ = '\0';
        input.data_._7_1_ = '\0';
        input.data_._0_4_ = uVar1;
        view_masks.data_.s.str = (Ch *)0x4050000001518cd;
        view_masks.data_.n = (Number)0xd;
        input.data_.s.str = (Ch *)((ulong)(-1 < (int)uVar1) << 0x35 | 0x1d6000000000000);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember(&dep,&view_masks,&input,alloc);
        uVar1 = *(uint *)((long)pVVar2 + lVar8 + -0xc);
        input.data_._4_1_ = '\0';
        input.data_._5_1_ = '\0';
        input.data_._6_1_ = '\0';
        input.data_._7_1_ = '\0';
        input.data_._0_4_ = uVar1;
        view_masks.data_.s.str = (Ch *)0x4050000001518b2;
        view_masks.data_.n = (Number)0xd;
        input.data_.s.str = (Ch *)((ulong)(-1 < (int)uVar1) << 0x35 | 0x1d6000000000000);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember(&dep,&view_masks,&input,alloc);
        uVar1 = *(uint *)((long)pVVar2 + lVar8 + -0x10);
        input.data_._4_1_ = '\0';
        input.data_._5_1_ = '\0';
        input.data_._6_1_ = '\0';
        input.data_._7_1_ = '\0';
        input.data_._0_4_ = uVar1;
        view_masks.data_.s.str = (Ch *)0x4050000001518c0;
        view_masks.data_.n = (Number)0xc;
        input.data_.s.str = (Ch *)((ulong)(-1 < (int)uVar1) << 0x35 | 0x1d6000000000000);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember(&dep,&view_masks,&input,alloc);
        uVar1 = *(uint *)((long)pVVar2 + lVar8 + -0x14);
        input.data_._4_1_ = '\0';
        input.data_._5_1_ = '\0';
        input.data_._6_1_ = '\0';
        input.data_._7_1_ = '\0';
        input.data_._0_4_ = uVar1;
        view_masks.data_.s.str = (Ch *)0x4050000001518a5;
        view_masks.data_.n = (Number)0xc;
        input.data_.s.str = (Ch *)((ulong)(-1 < (int)uVar1) << 0x35 | 0x1d6000000000000);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember(&dep,&view_masks,&input,alloc);
        uVar1 = *(uint *)((long)pVVar2 + lVar8 + -0x18);
        input.data_._4_1_ = '\0';
        input.data_._5_1_ = '\0';
        input.data_._6_1_ = '\0';
        input.data_._7_1_ = '\0';
        input.data_._0_4_ = uVar1;
        view_masks.data_.s.str = (Ch *)0x405000000153237;
        view_masks.data_.n = (Number)0xa;
        input.data_.s.str = (Ch *)((ulong)(-1 < (int)uVar1) << 0x35 | 0x1d6000000000000);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember(&dep,&view_masks,&input,alloc);
        uVar1 = *(uint *)((long)pVVar2 + lVar8 + -0x1c);
        input.data_._4_1_ = '\0';
        input.data_._5_1_ = '\0';
        input.data_._6_1_ = '\0';
        input.data_._7_1_ = '\0';
        input.data_._0_4_ = uVar1;
        view_masks.data_.s.str = (Ch *)0x40500000015322c;
        view_masks.data_.n = (Number)0xa;
        input.data_.s.str = (Ch *)((ulong)(-1 < (int)uVar1) << 0x35 | 0x1d6000000000000);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember(&dep,&view_masks,&input,alloc);
        local_40.s = "viewOffset";
        local_40.length = 10;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<int>(&dep,&local_40,*(int *)((long)&pVVar2->sType + lVar8),alloc);
        pvVar3 = *(void **)((long)pVVar2 + lVar8 + -0x24);
        if (pvVar3 != (void *)0x0) {
          view_masks.data_.n = (Number)0x0;
          view_masks.data_.s.str = (Ch *)0x0;
          bVar6 = pnext_chain_json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                            (pvVar3,alloc,&view_masks,(DynamicStateInfo *)0x0);
          if (!bVar6) {
            return false;
          }
          input.data_.s.str = (Ch *)0x405000000150e25;
          input.data_.n = (Number)0x5;
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::AddMember(&dep,&input,&view_masks,alloc);
        }
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::PushBack(&deps,&dep,alloc);
        uVar9 = uVar9 + 1;
        lVar8 = lVar8 + 0x30;
      } while (uVar9 < pass->dependencyCount);
    }
    input.data_.s.str = (Ch *)0x405000000151001;
    input.data_.n = (Number)0xc;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_118.s,&input,&deps,alloc);
  }
  if (pass->pAttachments != (VkAttachmentDescription2 *)0x0) {
    if (pass->attachmentCount != 0) {
      lVar8 = 0x30;
      uVar9 = 0;
      do {
        pVVar4 = pass->pAttachments;
        dep.data_.n = (Number)0x0;
        dep.data_.s.str = (Ch *)0x3000000000000;
        uVar1 = *(uint *)((long)pVVar4 + lVar8 + -0x20);
        input.data_._4_1_ = '\0';
        input.data_._5_1_ = '\0';
        input.data_._6_1_ = '\0';
        input.data_._7_1_ = '\0';
        input.data_._0_4_ = uVar1;
        view_masks.data_.s.str = (Ch *)0x405000000150d6f;
        view_masks.data_.n = (Number)0x5;
        input.data_.s.str = (Ch *)((ulong)(-1 < (int)uVar1) << 0x35 | 0x1d6000000000000);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember(&dep,&view_masks,&input,alloc);
        local_50.s = "format";
        local_50.length = 6;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<VkFormat>(&dep,&local_50,*(VkFormat *)((long)pVVar4 + lVar8 + -0x1c),alloc);
        local_60.s = "finalLayout";
        local_60.length = 0xb;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<VkImageLayout>
                  (&dep,&local_60,*(VkImageLayout *)((long)&pVVar4->sType + lVar8),alloc);
        local_70.s = "initialLayout";
        local_70.length = 0xd;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<VkImageLayout>
                  (&dep,&local_70,*(VkImageLayout *)((long)pVVar4 + lVar8 + -4),alloc);
        local_80.s = "loadOp";
        local_80.length = 6;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<VkAttachmentLoadOp>
                  (&dep,&local_80,*(VkAttachmentLoadOp *)((long)pVVar4 + lVar8 + -0x14),alloc);
        local_90.s = "storeOp";
        local_90.length = 7;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<VkAttachmentStoreOp>
                  (&dep,&local_90,*(VkAttachmentStoreOp *)((long)pVVar4 + lVar8 + -0x10),alloc);
        local_a0.s = "samples";
        local_a0.length = 7;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<VkSampleCountFlagBits>
                  (&dep,&local_a0,*(VkSampleCountFlagBits *)((long)pVVar4 + lVar8 + -0x18),alloc);
        local_b0.s = "stencilLoadOp";
        local_b0.length = 0xd;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<VkAttachmentLoadOp>
                  (&dep,&local_b0,*(VkAttachmentLoadOp *)((long)pVVar4 + lVar8 + -0xc),alloc);
        local_c0.s = "stencilStoreOp";
        local_c0.length = 0xe;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<VkAttachmentStoreOp>
                  (&dep,&local_c0,*(VkAttachmentStoreOp *)((long)pVVar4 + lVar8 + -8),alloc);
        pvVar3 = *(void **)((long)pVVar4 + lVar8 + -0x28);
        if (pvVar3 != (void *)0x0) {
          view_masks.data_.n = (Number)0x0;
          view_masks.data_.s.str = (Ch *)0x0;
          bVar6 = pnext_chain_json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                            (pvVar3,alloc,&view_masks,(DynamicStateInfo *)0x0);
          if (!bVar6) {
            return false;
          }
          input.data_.s.str = (Ch *)0x405000000150e25;
          input.data_.n = (Number)0x5;
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::AddMember(&dep,&input,&view_masks,alloc);
        }
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::PushBack(&attachments,&dep,alloc);
        uVar9 = uVar9 + 1;
        lVar8 = lVar8 + 0x38;
      } while (uVar9 < pass->attachmentCount);
    }
    input.data_.s.str = (Ch *)0x405000000150ff5;
    input.data_.n = (Number)0xb;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_118.s,&input,&attachments,alloc);
  }
  if (pass->subpassCount != 0) {
    uVar9 = 0;
    do {
      pVVar5 = pass->pSubpasses;
      dep.data_.n = (Number)0x0;
      dep.data_.s.str = (Ch *)0x3000000000000;
      input.data_._4_1_ = '\0';
      input.data_._5_1_ = '\0';
      input.data_._6_1_ = '\0';
      input.data_._7_1_ = '\0';
      input.data_._0_4_ = pVVar5[uVar9].flags;
      view_masks.data_.s.str = (Ch *)0x405000000150d6f;
      view_masks.data_.n = (Number)0x5;
      input.data_.s.str = (Ch *)((ulong)(-1 < (int)pVVar5[uVar9].flags) << 0x35 | 0x1d6000000000000)
      ;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&dep,&view_masks,&input,alloc);
      local_d0.s = "pipelineBindPoint";
      local_d0.length = 0x11;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<VkPipelineBindPoint>(&dep,&local_d0,pVVar5[uVar9].pipelineBindPoint,alloc);
      input.data_._4_1_ = '\0';
      input.data_._5_1_ = '\0';
      input.data_._6_1_ = '\0';
      input.data_._7_1_ = '\0';
      input.data_._0_4_ = pVVar5[uVar9].viewMask;
      view_masks.data_.s.str = (Ch *)0x405000000150fd8;
      view_masks.data_.n = (Number)0x8;
      input.data_.s.str =
           (Ch *)((ulong)(-1 < (int)pVVar5[uVar9].viewMask) << 0x35 | 0x1d6000000000000);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&dep,&view_masks,&input,alloc);
      if (pVVar5[uVar9].pPreserveAttachments != (uint32_t *)0x0) {
        view_masks.data_.n = (Number)0x0;
        view_masks.data_.s.str = (Ch *)0x4000000000000;
        if (pVVar5[uVar9].preserveAttachmentCount != 0) {
          uVar7 = 0;
          do {
            input.data_._4_1_ = '\0';
            input.data_._5_1_ = '\0';
            input.data_._6_1_ = '\0';
            input.data_._7_1_ = '\0';
            input.data_._0_4_ = pVVar5[uVar9].pPreserveAttachments[uVar7];
            input.data_.s.str =
                 (Ch *)((ulong)(-1 < (int)pVVar5[uVar9].pPreserveAttachments[uVar7]) << 0x35 |
                       0x1d6000000000000);
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::PushBack(&view_masks,&input,alloc);
            uVar7 = uVar7 + 1;
          } while (uVar7 < pVVar5[uVar9].preserveAttachmentCount);
        }
        input.data_.s.str = (Ch *)0x405000000150fc4;
        input.data_.n = (Number)0x13;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember(&dep,&input,&view_masks,alloc);
      }
      if (pVVar5[uVar9].pInputAttachments != (VkAttachmentReference2 *)0x0) {
        view_masks.data_.n = (Number)0x0;
        view_masks.data_.s.str = (Ch *)0x4000000000000;
        if (pVVar5[uVar9].inputAttachmentCount != 0) {
          lVar8 = 0;
          uVar7 = 0;
          do {
            input.data_.n = (Number)0x0;
            input.data_.s.str = (Ch *)0x0;
            bVar6 = json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                              ((VkAttachmentReference2 *)
                               ((long)&(pVVar5[uVar9].pInputAttachments)->sType + lVar8),alloc,
                               &input);
            if (!bVar6) {
              return false;
            }
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::PushBack(&view_masks,&input,alloc);
            uVar7 = uVar7 + 1;
            lVar8 = lVar8 + 0x20;
          } while (uVar7 < pVVar5[uVar9].inputAttachmentCount);
        }
        input.data_.s.str = (Ch *)0x405000000150fa2;
        input.data_.n = (Number)0x10;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember(&dep,&input,&view_masks,alloc);
      }
      if (pVVar5[uVar9].pColorAttachments != (VkAttachmentReference2 *)0x0) {
        view_masks.data_.n = (Number)0x0;
        view_masks.data_.s.str = (Ch *)0x4000000000000;
        if (pVVar5[uVar9].colorAttachmentCount != 0) {
          lVar8 = 0;
          uVar7 = 0;
          do {
            input.data_.n = (Number)0x0;
            input.data_.s.str = (Ch *)0x0;
            bVar6 = json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                              ((VkAttachmentReference2 *)
                               ((long)&(pVVar5[uVar9].pColorAttachments)->sType + lVar8),alloc,
                               &input);
            if (!bVar6) {
              return false;
            }
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::PushBack(&view_masks,&input,alloc);
            uVar7 = uVar7 + 1;
            lVar8 = lVar8 + 0x20;
          } while (uVar7 < pVVar5[uVar9].colorAttachmentCount);
        }
        input.data_.s.str = (Ch *)0x405000000150fb3;
        input.data_.n = (Number)0x10;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember(&dep,&input,&view_masks,alloc);
      }
      if (pVVar5[uVar9].pResolveAttachments != (VkAttachmentReference2 *)0x0) {
        view_masks.data_.n = (Number)0x0;
        view_masks.data_.s.str = (Ch *)0x4000000000000;
        if (pVVar5[uVar9].colorAttachmentCount != 0) {
          lVar8 = 0;
          uVar7 = 0;
          do {
            input.data_.n = (Number)0x0;
            input.data_.s.str = (Ch *)0x0;
            bVar6 = json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                              ((VkAttachmentReference2 *)
                               ((long)&(pVVar5[uVar9].pResolveAttachments)->sType + lVar8),alloc,
                               &input);
            if (!bVar6) {
              return false;
            }
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::PushBack(&view_masks,&input,alloc);
            uVar7 = uVar7 + 1;
            lVar8 = lVar8 + 0x20;
          } while (uVar7 < pVVar5[uVar9].colorAttachmentCount);
        }
        input.data_.s.str = (Ch *)0x405000000150f8f;
        input.data_.n = (Number)0x12;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember(&dep,&input,&view_masks,alloc);
      }
      if (pVVar5[uVar9].pDepthStencilAttachment != (VkAttachmentReference2 *)0x0) {
        view_masks.data_.n = (Number)0x0;
        view_masks.data_.s.str = (Ch *)0x0;
        bVar6 = json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                          (pVVar5[uVar9].pDepthStencilAttachment,alloc,&view_masks);
        if (!bVar6) {
          return false;
        }
        input.data_.s.str = (Ch *)0x405000000150f78;
        input.data_.n = (Number)0x16;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember(&dep,&input,&view_masks,alloc);
      }
      if (pVVar5[uVar9].pNext != (void *)0x0) {
        view_masks.data_.n = (Number)0x0;
        view_masks.data_.s.str = (Ch *)0x0;
        bVar6 = pnext_chain_json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                          (pVVar5[uVar9].pNext,alloc,&view_masks,(DynamicStateInfo *)0x0);
        if (!bVar6) {
          return false;
        }
        input.data_.s.str = (Ch *)0x405000000150e25;
        input.data_.n = (Number)0x5;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember(&dep,&input,&view_masks,alloc);
      }
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::PushBack(&subpasses,&dep,alloc);
      uVar9 = uVar9 + 1;
    } while (uVar9 < pass->subpassCount);
  }
  input.data_.s.str = (Ch *)0x40500000015100e;
  input.data_.n = (Number)0x9;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_118.s,&input,&subpasses,alloc);
  if (pass->pNext != (void *)0x0) {
    view_masks.data_.n = (Number)0x0;
    view_masks.data_.s.str = (Ch *)0x0;
    bVar6 = pnext_chain_json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                      (pass->pNext,alloc,&view_masks,(DynamicStateInfo *)0x0);
    if (!bVar6) {
      return false;
    }
    input.data_.s.str = (Ch *)0x405000000150e25;
    input.data_.n = (Number)0x5;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_118.s,&input,&view_masks,alloc);
  }
  if (&local_118 != &out_value->data_) {
    (out_value->data_).n = local_118.n;
    (out_value->data_).s.str = local_118.s.str;
  }
  return true;
}

Assistant:

static bool json_value(const VkRenderPassCreateInfo2 &pass, Allocator &alloc, Value *out_value)
{
	Value json_object(kObjectType);
	json_object.AddMember("flags", pass.flags, alloc);

	Value deps(kArrayType);
	Value subpasses(kArrayType);
	Value attachments(kArrayType);

	if (pass.pCorrelatedViewMasks)
	{
		Value view_masks(kArrayType);
		for (uint32_t i = 0; i < pass.correlatedViewMaskCount; i++)
			view_masks.PushBack(pass.pCorrelatedViewMasks[i], alloc);
		json_object.AddMember("correlatedViewMasks", view_masks, alloc);
	}

	if (pass.pDependencies)
	{
		for (uint32_t i = 0; i < pass.dependencyCount; i++)
		{
			auto &d = pass.pDependencies[i];
			Value dep(kObjectType);
			dep.AddMember("dependencyFlags", d.dependencyFlags, alloc);
			dep.AddMember("dstAccessMask", d.dstAccessMask, alloc);
			dep.AddMember("srcAccessMask", d.srcAccessMask, alloc);
			dep.AddMember("dstStageMask", d.dstStageMask, alloc);
			dep.AddMember("srcStageMask", d.srcStageMask, alloc);
			dep.AddMember("dstSubpass", d.dstSubpass, alloc);
			dep.AddMember("srcSubpass", d.srcSubpass, alloc);
			dep.AddMember("viewOffset", d.viewOffset, alloc);
			if (!pnext_chain_add_json_value(dep, d, alloc, nullptr))
				return false;
			deps.PushBack(dep, alloc);
		}
		json_object.AddMember("dependencies", deps, alloc);
	}

	if (pass.pAttachments)
	{
		for (uint32_t i = 0; i < pass.attachmentCount; i++)
		{
			auto &a = pass.pAttachments[i];
			Value att(kObjectType);

			att.AddMember("flags", a.flags, alloc);
			att.AddMember("format", a.format, alloc);
			att.AddMember("finalLayout", a.finalLayout, alloc);
			att.AddMember("initialLayout", a.initialLayout, alloc);
			att.AddMember("loadOp", a.loadOp, alloc);
			att.AddMember("storeOp", a.storeOp, alloc);
			att.AddMember("samples", a.samples, alloc);
			att.AddMember("stencilLoadOp", a.stencilLoadOp, alloc);
			att.AddMember("stencilStoreOp", a.stencilStoreOp, alloc);
			if (!pnext_chain_add_json_value(att, a, alloc, nullptr))
				return false;
			attachments.PushBack(att, alloc);
		}
		json_object.AddMember("attachments", attachments, alloc);
	}

	for (uint32_t i = 0; i < pass.subpassCount; i++)
	{
		auto &sub = pass.pSubpasses[i];
		Value p(kObjectType);
		p.AddMember("flags", sub.flags, alloc);
		p.AddMember("pipelineBindPoint", sub.pipelineBindPoint, alloc);
		p.AddMember("viewMask", sub.viewMask, alloc);

		if (sub.pPreserveAttachments)
		{
			Value preserves(kArrayType);
			for (uint32_t j = 0; j < sub.preserveAttachmentCount; j++)
				preserves.PushBack(sub.pPreserveAttachments[j], alloc);
			p.AddMember("preserveAttachments", preserves, alloc);
		}

		if (sub.pInputAttachments)
		{
			Value inputs(kArrayType);
			for (uint32_t j = 0; j < sub.inputAttachmentCount; j++)
			{
				Value input;
				if (!json_value(sub.pInputAttachments[j], alloc, &input))
					return false;
				inputs.PushBack(input, alloc);
			}
			p.AddMember("inputAttachments", inputs, alloc);
		}

		if (sub.pColorAttachments)
		{
			Value colors(kArrayType);
			for (uint32_t j = 0; j < sub.colorAttachmentCount; j++)
			{
				Value color;
				if (!json_value(sub.pColorAttachments[j], alloc, &color))
					return false;
				colors.PushBack(color, alloc);
			}
			p.AddMember("colorAttachments", colors, alloc);
		}

		if (sub.pResolveAttachments)
		{
			Value resolves(kArrayType);
			for (uint32_t j = 0; j < sub.colorAttachmentCount; j++)
			{
				Value resolve;
				if (!json_value(sub.pResolveAttachments[j], alloc, &resolve))
					return false;
				resolves.PushBack(resolve, alloc);
			}
			p.AddMember("resolveAttachments", resolves, alloc);
		}

		if (sub.pDepthStencilAttachment)
		{
			Value depth_stencil;
			if (!json_value(*sub.pDepthStencilAttachment, alloc, &depth_stencil))
				return false;
			p.AddMember("depthStencilAttachment", depth_stencil, alloc);
		}

		if (!pnext_chain_add_json_value(p, sub, alloc, nullptr))
			return false;
		subpasses.PushBack(p, alloc);
	}
	json_object.AddMember("subpasses", subpasses, alloc);

	if (!pnext_chain_add_json_value(json_object, pass, alloc, nullptr))
		return false;

	*out_value = json_object;
	return true;
}